

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O3

size_t __thiscall opengv::math::Sturm::evaluateChain2(Sturm *this,double bound)

{
  double dVar1;
  undefined1 auVar2 [16];
  long lVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  vector<double,_std::allocator<double>_> signs;
  vector<double,_std::allocator<double>_> monomials;
  vector<double,_std::allocator<double>_> local_78;
  double local_58;
  double local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58 = bound;
  std::vector<double,_std::allocator<double>_>::resize(&local_48,this->_dimension);
  uVar5 = this->_dimension;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[uVar5 - 1] = 1.0;
  if (1 < uVar5) {
    dVar1 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5 - 1];
    uVar10 = 3;
    if (3 < uVar5 + 1) {
      uVar10 = uVar5 + 1;
    }
    lVar6 = -2;
    do {
      dVar1 = dVar1 * local_58;
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar5 + lVar6] = dVar1;
      lVar6 = lVar6 + -1;
    } while (-lVar6 != uVar10);
  }
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(&local_78,uVar5);
  uVar5 = this->_dimension;
  if (uVar5 == 0) {
    sVar7 = 0;
  }
  else {
    lVar6 = 0;
    uVar10 = 0;
    do {
      local_50 = 0.0;
      if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_50);
        uVar5 = this->_dimension;
      }
      else {
        *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = 0.0;
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      if (uVar10 < uVar5) {
        lVar3 = (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
        auVar11 = ZEXT864((ulong)local_78.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish[-1]);
        pdVar8 = (double *)
                 ((lVar3 + 1) * lVar6 +
                 (long)(this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data);
        uVar9 = uVar10;
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *pdVar8;
          pdVar8 = pdVar8 + lVar3;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar9];
          auVar2 = vfmadd231sd_fma(auVar11._0_16_,auVar12,auVar2);
          auVar11 = ZEXT1664(auVar2);
          uVar9 = uVar9 + 1;
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] = auVar2._0_8_;
        } while (uVar5 != uVar9);
      }
      uVar10 = uVar10 + 1;
      lVar6 = lVar6 + 8;
    } while (uVar10 < uVar5);
    sVar7 = 0;
    if (1 < uVar5) {
      uVar10 = 1;
      bVar4 = 0.0 < *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
      do {
        if (bVar4) {
          bVar4 = true;
          if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10] < 0.0) {
            sVar7 = (size_t)((int)sVar7 + 1);
LAB_0024d981:
            bVar4 = false;
          }
        }
        else {
          if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10] <= 0.0) goto LAB_0024d981;
          sVar7 = (size_t)((int)sVar7 + 1);
          bVar4 = true;
        }
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
      sVar7 = (size_t)(int)sVar7;
    }
  }
  operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return sVar7;
}

Assistant:

size_t
opengv::math::Sturm::evaluateChain2( double bound )
{  
  std::vector<double> monomials;
  monomials.resize(_dimension);
  monomials[_dimension-1] = 1.0;
  
  //evaluate all monomials at the bound
  for(size_t i = 2; i <= _dimension; i++)
    monomials[_dimension-i] = monomials[_dimension-i+1]*bound;
  
  std::vector<double> signs;
  signs.reserve(_dimension);
  for( size_t i = 0; i < _dimension; i++ )
  {
    signs.push_back(0.0);
    for( size_t j = i; j < _dimension; j++ )
      signs.back() += _C(i,j) * monomials[j];
  }
  
  bool positive = false;
  if( signs[0] > 0.0 )
    positive = true;
  
  int signChanges = 0;
  
  for( size_t i = 1; i < _dimension; i++ )
  {
    if( positive )
    {
      if( signs[i] < 0.0 )
      {
        signChanges++;
        positive = false;
      }
    }
    else
    {
      if( signs[i] > 0.0 )
      {
        signChanges++;
        positive = true;
      }
    }
  }
  
  return signChanges;
}